

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O3

int ggml_backend_sched_backend_from_buffer
              (ggml_backend_sched_t sched,ggml_tensor *tensor,ggml_tensor *op)

{
  ggml_backend_buffer *pgVar1;
  ggml_backend_dev_t pgVar2;
  _Bool _Var3;
  ggml_tensor *pgVar4;
  long lVar5;
  
  pgVar4 = tensor->view_src;
  if (tensor->view_src == (ggml_tensor *)0x0) {
    pgVar4 = tensor;
  }
  pgVar1 = pgVar4->buffer;
  if ((pgVar1 != (ggml_backend_buffer *)0x0) && (0 < sched->n_backends)) {
    lVar5 = 0;
    do {
      pgVar2 = sched->backends[lVar5]->device;
      _Var3 = (*(pgVar2->iface).supports_buft)(pgVar2,pgVar1->buft);
      if ((_Var3) &&
         (pgVar2 = sched->backends[lVar5]->device, _Var3 = (*(pgVar2->iface).supports_op)(pgVar2,op)
         , _Var3)) {
        return (int)lVar5;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < sched->n_backends);
  }
  return -1;
}

Assistant:

static int ggml_backend_sched_backend_from_buffer(ggml_backend_sched_t sched, const struct ggml_tensor * tensor, const struct ggml_tensor * op) {
    ggml_backend_buffer_t buffer = tensor->view_src ? tensor->view_src->buffer : tensor->buffer;
    if (buffer == NULL) {
        return -1;
    }

    // find highest prio backend that supports the buffer type and the op
    for (int i = 0; i < sched->n_backends; i++) {
        if (ggml_backend_supports_buft(sched->backends[i], buffer->buft) &&
            ggml_backend_supports_op(sched->backends[i], op)) {
            return i;
        }
    }

#ifndef NDEBUG
    GGML_LOG_DEBUG("%s: warning: no backend supports op %s with a weight with buffer type %s used in tensor %s, the weight will need to be copied\n",
        __func__, ggml_op_desc(tensor), ggml_backend_buffer_name(buffer), tensor->name);
#endif

    return -1;
}